

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O2

void af_cjk_metrics_init_widths(AF_CJKMetrics metrics,FT_Face face)

{
  char *pcVar1;
  AF_WidthRec *table;
  FT_Memory pFVar2;
  FT_GlyphSlot pFVar3;
  AF_Segment_conflict pAVar4;
  ushort uVar5;
  AF_CJKAxisRec *pAVar6;
  FT_Error FVar7;
  char *p;
  AF_Segment_conflict pAVar8;
  char cVar9;
  ulong uVar10;
  AF_Segment_conflict pAVar11;
  ushort uVar12;
  long lVar13;
  int iVar14;
  FT_ULong FVar15;
  ulong uVar16;
  FT_UInt local_aaec;
  AF_CJKAxisRec *local_aae8;
  FT_ULong shaper_buf_;
  AF_GlyphHintsRec hints [1];
  AF_CJKMetricsRec dummy [1];
  
  pFVar2 = face->memory;
  FVar15 = 0;
  memset(&hints[0].x_scale,0,0x1420);
  metrics->axis[0].width_count = 0;
  metrics->axis[1].width_count = 0;
  p = af_script_classes[((metrics->root).style_class)->script]->standard_charstring;
  hints[0].memory = pFVar2;
  do {
    cVar9 = *p;
    if (cVar9 == '\0') break;
    while (cVar9 == ' ') {
      pcVar1 = p + 1;
      p = p + 1;
      cVar9 = *pcVar1;
    }
    p = af_shaper_get_cluster(p,&metrics->root,&shaper_buf_,(uint *)dummy);
    if (1 >= (uint)dummy[0].root.style_class) {
      FVar15 = shaper_buf_;
    }
  } while (1 < (uint)dummy[0].root.style_class || shaper_buf_ == 0);
  if (FVar15 != 0) {
    FVar7 = FT_Load_Glyph(face,(FT_UInt)FVar15,1);
    if ((FVar7 == 0) && (pFVar3 = face->glyph, 0 < (pFVar3->outline).n_points)) {
      memset(dummy,0,0x7830);
      dummy[0].units_per_em = metrics->units_per_em;
      dummy[0].root.scaler.x_scale = 0x10000;
      dummy[0].root.scaler.y_scale = 0x10000;
      dummy[0].root.scaler.x_delta = 0;
      dummy[0].root.scaler.y_delta = 0;
      dummy[0].root.scaler.flags = 0;
      hints[0].scaler_flags = 0;
      hints[0].metrics = &dummy[0].root;
      dummy[0].root.scaler.face = face;
      FVar7 = af_glyph_hints_reload(hints,&pFVar3->outline);
      if (FVar7 == 0) {
        local_aae8 = metrics->axis;
        for (lVar13 = 0; pAVar6 = local_aae8, lVar13 != 2; lVar13 = lVar13 + 1) {
          FVar7 = af_latin_hints_compute_segments(hints,(AF_Dimension)lVar13);
          if (FVar7 != 0) break;
          af_latin_hints_link_segments(hints,0,(AF_WidthRec *)0x0,(AF_Dimension)lVar13);
          pAVar8 = hints[0].axis[lVar13].segments;
          pAVar11 = pAVar8 + hints[0].axis[lVar13].num_segments;
          table = pAVar6[lVar13].widths;
          uVar10 = 0;
          for (; local_aaec = (FT_UInt)uVar10, pAVar8 < pAVar11; pAVar8 = pAVar8 + 1) {
            pAVar4 = pAVar8->link;
            uVar16 = uVar10;
            if ((pAVar4 != (AF_Segment_conflict)0x0) &&
               ((local_aaec < 0x10 && pAVar8 < pAVar4) && pAVar8 == pAVar4->link)) {
              iVar14 = (int)pAVar8->pos - (int)pAVar4->pos;
              uVar5 = (ushort)iVar14;
              uVar12 = -uVar5;
              if (0 < iVar14) {
                uVar12 = uVar5;
              }
              uVar16 = (ulong)(local_aaec + 1);
              table[uVar10].org = (ulong)uVar12;
            }
            uVar10 = uVar16;
          }
          af_sort_and_quantize_widths(&local_aaec,table,(ulong)dummy[0].units_per_em / 100);
          pAVar6[lVar13].width_count = local_aaec;
        }
      }
    }
  }
  for (lVar13 = 0x1f8; lVar13 != 0x79d8; lVar13 = lVar13 + 0x3bf0) {
    if (*(int *)((long)metrics + lVar13 + -0x198) == 0) {
      uVar10 = (ulong)metrics->units_per_em * 0x32 >> 0xb;
    }
    else {
      uVar10 = *(ulong *)((long)metrics + lVar13 + -400);
    }
    *(long *)((long)(metrics->axis[0].widths + -5) + lVar13) = (long)uVar10 / 5;
    *(ulong *)((long)metrics->axis[0].widths + lVar13 + -0x70) = uVar10;
    *(undefined1 *)((long)metrics->axis[0].widths + lVar13 + -0x68) = 0;
  }
  af_glyph_hints_done(hints);
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  af_cjk_metrics_init_widths( AF_CJKMetrics  metrics,
                              FT_Face        face )
  {
    /* scan the array of segments in each direction */
    AF_GlyphHintsRec  hints[1];


    FT_TRACE5(( "\n" ));
    FT_TRACE5(( "cjk standard widths computation (style `%s')\n",
                af_style_names[metrics->root.style_class->style] ));
    FT_TRACE5(( "===================================================\n" ));
    FT_TRACE5(( "\n" ));

    af_glyph_hints_init( hints, face->memory );

    metrics->axis[AF_DIMENSION_HORZ].width_count = 0;
    metrics->axis[AF_DIMENSION_VERT].width_count = 0;

    {
      FT_Error          error;
      FT_ULong          glyph_index;
      int               dim;
      AF_CJKMetricsRec  dummy[1];
      AF_Scaler         scaler = &dummy->root.scaler;

      AF_StyleClass   style_class  = metrics->root.style_class;
      AF_ScriptClass  script_class = af_script_classes[style_class->script];

      /* If HarfBuzz is not available, we need a pointer to a single */
      /* unsigned long value.                                        */
#ifdef FT_CONFIG_OPTION_USE_HARFBUZZ
      void*     shaper_buf;
#else
      FT_ULong  shaper_buf_;
      void*     shaper_buf = &shaper_buf_;
#endif

      const char*  p;

#ifdef FT_DEBUG_LEVEL_TRACE
      FT_ULong  ch = 0;
#endif

      p = script_class->standard_charstring;

#ifdef FT_CONFIG_OPTION_USE_HARFBUZZ
      shaper_buf = af_shaper_buf_create( face );
#endif

      /* We check a list of standard characters.  The first match wins. */

      glyph_index = 0;
      while ( *p )
      {
        unsigned int  num_idx;

#ifdef FT_DEBUG_LEVEL_TRACE
        const char*  p_old;
#endif


        while ( *p == ' ' )
          p++;

#ifdef FT_DEBUG_LEVEL_TRACE
        p_old = p;
        GET_UTF8_CHAR( ch, p_old );
#endif

        /* reject input that maps to more than a single glyph */
        p = af_shaper_get_cluster( p, &metrics->root, shaper_buf, &num_idx );
        if ( num_idx > 1 )
          continue;

        /* otherwise exit loop if we have a result */
        glyph_index = af_shaper_get_elem( &metrics->root,
                                          shaper_buf,
                                          0,
                                          NULL,
                                          NULL );
        if ( glyph_index )
          break;
      }

      af_shaper_buf_destroy( face, shaper_buf );

      if ( !glyph_index )
        goto Exit;

      if ( !glyph_index )
        goto Exit;

      FT_TRACE5(( "standard character: U+%04lX (glyph index %ld)\n",
                  ch, glyph_index ));

      error = FT_Load_Glyph( face, glyph_index, FT_LOAD_NO_SCALE );
      if ( error || face->glyph->outline.n_points <= 0 )
        goto Exit;

      FT_ZERO( dummy );

      dummy->units_per_em = metrics->units_per_em;

      scaler->x_scale = 0x10000L;
      scaler->y_scale = 0x10000L;
      scaler->x_delta = 0;
      scaler->y_delta = 0;

      scaler->face        = face;
      scaler->render_mode = FT_RENDER_MODE_NORMAL;
      scaler->flags       = 0;

      af_glyph_hints_rescale( hints, (AF_StyleMetrics)dummy );

      error = af_glyph_hints_reload( hints, &face->glyph->outline );
      if ( error )
        goto Exit;

      for ( dim = 0; dim < AF_DIMENSION_MAX; dim++ )
      {
        AF_CJKAxis    axis    = &metrics->axis[dim];
        AF_AxisHints  axhints = &hints->axis[dim];
        AF_Segment    seg, limit, link;
        FT_UInt       num_widths = 0;


        error = af_latin_hints_compute_segments( hints,
                                                 (AF_Dimension)dim );
        if ( error )
          goto Exit;

        /*
         * We assume that the glyphs selected for the stem width
         * computation are `featureless' enough so that the linking
         * algorithm works fine without adjustments of its scoring
         * function.
         */
        af_latin_hints_link_segments( hints,
                                      0,
                                      NULL,
                                      (AF_Dimension)dim );

        seg   = axhints->segments;
        limit = seg + axhints->num_segments;

        for ( ; seg < limit; seg++ )
        {
          link = seg->link;

          /* we only consider stem segments there! */
          if ( link && link->link == seg && link > seg )
          {
            FT_Pos  dist;


            dist = seg->pos - link->pos;
            if ( dist < 0 )
              dist = -dist;

            if ( num_widths < AF_CJK_MAX_WIDTHS )
              axis->widths[num_widths++].org = dist;
          }
        }

        /* this also replaces multiple almost identical stem widths */
        /* with a single one (the value 100 is heuristic)           */
        af_sort_and_quantize_widths( &num_widths, axis->widths,
                                     dummy->units_per_em / 100 );
        axis->width_count = num_widths;
      }

    Exit:
      for ( dim = 0; dim < AF_DIMENSION_MAX; dim++ )
      {
        AF_CJKAxis  axis = &metrics->axis[dim];
        FT_Pos      stdw;


        stdw = ( axis->width_count > 0 ) ? axis->widths[0].org
                                         : AF_LATIN_CONSTANT( metrics, 50 );

        /* let's try 20% of the smallest width */
        axis->edge_distance_threshold = stdw / 5;
        axis->standard_width          = stdw;
        axis->extra_light             = 0;

#ifdef FT_DEBUG_LEVEL_TRACE
        {
          FT_UInt  i;


          FT_TRACE5(( "%s widths:\n",
                      dim == AF_DIMENSION_VERT ? "horizontal"
                                               : "vertical" ));

          FT_TRACE5(( "  %ld (standard)", axis->standard_width ));
          for ( i = 1; i < axis->width_count; i++ )
            FT_TRACE5(( " %ld", axis->widths[i].org ));

          FT_TRACE5(( "\n" ));
        }
#endif
      }
    }

    FT_TRACE5(( "\n" ));

    af_glyph_hints_done( hints );
  }